

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

IntegralConvertResult __thiscall
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (str_format_internal *this,float v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  undefined4 in_register_00000014;
  str_format_internal *local_10;
  int local_8;
  
  local_8 = conv._0_4_;
  if ((byte)this == 0x12) {
    local_10 = (str_format_internal *)CONCAT71((int7)((ulong)this >> 8),0xc);
  }
  else {
    local_10 = this;
    if (((byte)this & 0xf8) != 8) {
      return (IntegralConvertResult)false;
    }
  }
  bVar1 = ConvertFloatImpl(v,(FormatConversionSpecImpl *)&local_10,
                           (FormatSinkImpl *)CONCAT44(in_register_00000014,conv.precision_));
  return (IntegralConvertResult)bVar1;
}

Assistant:

FloatingConvertResult FormatConvertImpl(float v,
                                        const FormatConversionSpecImpl conv,
                                        FormatSinkImpl *sink) {
  return {ConvertFloatArg(v, conv, sink)};
}